

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::BP4Writer::WriteCollectiveMetadataFile(BP4Writer *this,bool isFinal)

{
  BP4Serializer *this_00;
  unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *this_01;
  BufferSTL *this_02;
  code *pcVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  unsigned_long uVar4;
  long lVar5;
  long lVar6;
  unsigned_long uVar7;
  long lVar8;
  long lVar9;
  unsigned_long uVar10;
  long lVar11;
  pointer puVar12;
  int iVar13;
  uint64_t currentTimeStamp;
  mapped_type *pmVar14;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *p_Var15;
  mapped_type *pmVar16;
  unsigned_long *t;
  pointer puVar17;
  pointer pbVar18;
  BP4Writer *this_03;
  ulong uVar19;
  long lVar20;
  _Hash_node_base *p_Var21;
  key_type local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> timeSteps;
  ScopedTimer __var2633;
  string local_50;
  
  if (WriteCollectiveMetadataFile(bool)::__var633 == '\0') {
    iVar13 = __cxa_guard_acquire(&WriteCollectiveMetadataFile(bool)::__var633);
    if (iVar13 != 0) {
      WriteCollectiveMetadataFile::__var633 =
           (void *)ps_timer_create_("BP4Writer::WriteCollectiveMetadataFile");
      __cxa_guard_release(&WriteCollectiveMetadataFile(bool)::__var633);
    }
  }
  __var2633.m_timer = WriteCollectiveMetadataFile::__var633;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  if ((!isFinal) ||
     (*(long *)((this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3] + 0x1a0 +
               (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base) != 0)) {
    this_00 = &this->m_BP4Serializer;
    adios2::format::BP4Serializer::AggregateCollectiveMetadata
              (this_00,&(this->super_Engine).m_Comm,
               (BufferSTL *)
               ((this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3] + 0x88 +
               (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base),true);
    p_Var2 = (this_00->super_BP4Base)._vptr_BP4Base[-3];
    if (*(int *)(p_Var2 + 0x10 + (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base) == 0) {
      transportman::TransportMan::WriteFiles
                (&this->m_FileMetadataManager,
                 *(char **)(p_Var2 + 200 +
                           (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base),
                 *(size_t *)
                  (p_Var2 + 0xb8 + (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base),-1);
      transportman::TransportMan::FlushFiles(&this->m_FileMetadataManager,-1);
      if ((this->m_DrainBB == true) &&
         (pbVar18 = (this->m_MetadataFileNames).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         (this->m_MetadataFileNames).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish != pbVar18)) {
        lVar20 = 0;
        uVar19 = 0;
        do {
          burstbuffer::FileDrainer::AddOperationCopy
                    (&(this->m_FileDrainer).super_FileDrainer,
                     (string *)((long)&(pbVar18->_M_dataplus)._M_p + lVar20),
                     (string *)
                     ((long)&(((this->m_DrainMetadataFileNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar20),*(size_t *)
                              ((this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3] + 0xb8 +
                              (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base));
          uVar19 = uVar19 + 1;
          pbVar18 = (this->m_MetadataFileNames).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = lVar20 + 0x20;
        } while (uVar19 < (ulong)((long)(this->m_MetadataFileNames).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar18
                                 >> 5));
      }
      currentTimeStamp = time((time_t *)0x0);
      timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_01 = &(this->m_BP4Serializer).super_BP4Base.m_MetadataIndexTable;
      local_a0 = (key_type)
                 *(int *)((this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3] + 0x10 +
                         (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
      pmVar14 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_01,&local_a0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&timeSteps,(pmVar14->_M_h)._M_element_count);
      local_a0 = (key_type)
                 *(int *)((this_00->super_BP4Base)._vptr_BP4Base[-3] + 0x10 +
                         (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
      pmVar14 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_01,&local_a0);
      p_Var21 = (pmVar14->_M_h)._M_before_begin._M_nxt;
      if (p_Var21 != (_Hash_node_base *)0x0) {
        do {
          if (timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&timeSteps,
                       (iterator)
                       timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)(p_Var21 + 1));
          }
          else {
            *timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)p_Var21[1]._M_nxt;
            timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          p_Var21 = p_Var21->_M_nxt;
        } while (p_Var21 != (_Hash_node_base *)0x0);
      }
      puVar17 = timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      puVar12 = timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar19 = (long)timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar20 = 0x3f;
        if (uVar19 != 0) {
          for (; uVar19 >> lVar20 == 0; lVar20 = lVar20 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar12,puVar17);
      }
      puVar17 = timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      puVar12 = timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BP4 Index Table","");
      this_02 = &(this->m_BP4Serializer).super_BP4Base.m_MetadataIndex;
      adios2::format::BufferSTL::Resize
                (this_02,((long)puVar17 - (long)puVar12) * 8 + 0x40,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      puVar12 = timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar17 = timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          local_a0 = (key_type)
                     *(int *)((this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3] + 0x10 +
                             (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
          p_Var15 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_01,&local_a0);
          pmVar16 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](p_Var15,puVar17);
          pp_Var3 = (this->m_BP4Serializer).super_BP4Base._vptr_BP4Base;
          p_Var2 = pp_Var3[-3];
          lVar20 = *(long *)(p_Var2 + 0x1f8 +
                            (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
          uVar4 = *(pmVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar5 = *(long *)(p_Var2 + 0x20 +
                           (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
          local_a0 = (key_type)
                     *(int *)(pp_Var3[-3] + 0x10 +
                             (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
          p_Var15 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_01,&local_a0);
          pmVar16 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](p_Var15,puVar17);
          pp_Var3 = (this->m_BP4Serializer).super_BP4Base._vptr_BP4Base;
          p_Var2 = pp_Var3[-3];
          lVar6 = *(long *)(p_Var2 + 0x1f8 +
                           (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
          uVar7 = (pmVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start[1];
          lVar8 = *(long *)(p_Var2 + 0x20 +
                           (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
          local_a0 = (key_type)
                     *(int *)(pp_Var3[-3] + 0x10 +
                             (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
          p_Var15 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_01,&local_a0);
          pmVar16 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](p_Var15,puVar17);
          pp_Var3 = (this->m_BP4Serializer).super_BP4Base._vptr_BP4Base;
          p_Var2 = pp_Var3[-3];
          lVar9 = *(long *)(p_Var2 + 0x1f8 +
                           (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
          uVar10 = (pmVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[2];
          lVar11 = *(long *)(p_Var2 + 0x20 +
                            (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
          local_a0 = (key_type)
                     *(int *)(pp_Var3[-3] + 0x10 +
                             (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
          p_Var15 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_01,&local_a0);
          pmVar16 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](p_Var15,puVar17);
          pp_Var3 = (this->m_BP4Serializer).super_BP4Base._vptr_BP4Base;
          p_Var2 = pp_Var3[-3];
          this_03 = (BP4Writer *)
                    (*(long *)(p_Var2 + 0x1f8 +
                              (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base) +
                     (pmVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start[3] +
                    *(long *)(p_Var2 + 0x20 +
                             (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base));
          PopulateMetadataIndexFileContent
                    (this_03,this_02,*puVar17,
                     (long)*(int *)(pp_Var3[-3] + 0x10 +
                                   (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base),
                     lVar20 + uVar4 + lVar5,lVar6 + uVar7 + lVar8,lVar9 + uVar10 + lVar11,
                     (uint64_t)this_03,currentTimeStamp);
          puVar17 = puVar17 + 1;
        } while (puVar17 != puVar12);
      }
      transportman::TransportMan::WriteFiles
                (&this->m_FileMetadataIndexManager,
                 (this->m_BP4Serializer).super_BP4Base.m_MetadataIndex.m_Buffer.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start,(this->m_BP4Serializer).super_BP4Base.m_MetadataIndex.super_Buffer.
                          m_Position,-1);
      transportman::TransportMan::FlushFiles(&this->m_FileMetadataIndexManager,-1);
      p_Var2 = (this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3];
      pcVar1 = p_Var2 + 0x1f8 + (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base;
      *(long *)pcVar1 =
           *(long *)pcVar1 +
           *(long *)(p_Var2 + 0xb8 + (long)&(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base);
      if ((this->m_DrainBB == true) &&
         ((this->m_MetadataIndexFileNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->m_MetadataIndexFileNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        lVar20 = 0;
        uVar19 = 0;
        do {
          burstbuffer::FileDrainer::AddOperationWrite
                    (&(this->m_FileDrainer).super_FileDrainer,
                     (string *)
                     ((long)&(((this->m_DrainMetadataIndexFileNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar20),(this->m_BP4Serializer).super_BP4Base.m_MetadataIndex.super_Buffer.
                             m_Position,
                     (this->m_BP4Serializer).super_BP4Base.m_MetadataIndex.m_Buffer.
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_start);
          uVar19 = uVar19 + 1;
          lVar20 = lVar20 + 0x20;
        } while (uVar19 < (ulong)((long)(this->m_MetadataIndexFileNames).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_MetadataIndexFileNames).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      if (timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(timeSteps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    p_Var2 = (this_00->super_BP4Base)._vptr_BP4Base[-3];
    adios2::format::BPBase::ResetBuffer
              ((BPBase *)((long)&(this_00->super_BP4Base)._vptr_BP4Base + (long)p_Var2),
               (Buffer *)
               (p_Var2 + 0x48 + (long)&(this_00->super_BP4Base).m_MetadataIndex.super_Buffer),true,
               true);
    adios2::format::BPBase::ResetBuffer
              ((BPBase *)
               ((long)&(this_00->super_BP4Base)._vptr_BP4Base +
               (long)(this->m_BP4Serializer).super_BP4Base._vptr_BP4Base[-3]),
               &(this->m_BP4Serializer).super_BP4Base.m_MetadataIndex.super_Buffer,true,true);
    adios2::format::BP4Serializer::ResetMetadataIndexTable(this_00);
    adios2::format::BP4Serializer::ResetAllIndices(this_00);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2633);
  return;
}

Assistant:

void BP4Writer::WriteCollectiveMetadataFile(const bool isFinal)
{

    PERFSTUBS_SCOPED_TIMER("BP4Writer::WriteCollectiveMetadataFile");

    if (isFinal && m_BP4Serializer.m_MetadataSet.DataPGCount == 0)
    {
        // If data pg count is zero, it means all metadata
        // has already been written, don't need to write it again.
        return;
    }
    m_BP4Serializer.AggregateCollectiveMetadata(m_Comm, m_BP4Serializer.m_Metadata, true);

    if (m_BP4Serializer.m_RankMPI == 0)
    {

        m_FileMetadataManager.WriteFiles(m_BP4Serializer.m_Metadata.m_Buffer.data(),
                                         m_BP4Serializer.m_Metadata.m_Position);
        m_FileMetadataManager.FlushFiles();

        if (m_DrainBB)
        {
            for (size_t i = 0; i < m_MetadataFileNames.size(); ++i)
            {
                m_FileDrainer.AddOperationCopy(m_MetadataFileNames[i], m_DrainMetadataFileNames[i],
                                               m_BP4Serializer.m_Metadata.m_Position);
            }
        }

        std::time_t currentTimeStamp = std::time(nullptr);

        std::vector<size_t> timeSteps;
        timeSteps.reserve(m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI].size());
        for (auto const &pair : m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI])
        {
            timeSteps.push_back(pair.first);
        }
        std::sort(timeSteps.begin(), timeSteps.end());

        size_t rowsInMetadataIndexTable = timeSteps.size() + 1;
        m_BP4Serializer.m_MetadataIndex.Resize(rowsInMetadataIndexTable * 64, "BP4 Index Table");
        for (auto const &t : timeSteps)
        {
            const uint64_t pgIndexStartMetadataFile =
                m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI][t][0] +
                m_BP4Serializer.m_MetadataSet.MetadataFileLength +
                m_BP4Serializer.m_PreMetadataFileLength;
            const uint64_t varIndexStartMetadataFile =
                m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI][t][1] +
                m_BP4Serializer.m_MetadataSet.MetadataFileLength +
                m_BP4Serializer.m_PreMetadataFileLength;
            const uint64_t attrIndexStartMetadataFile =
                m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI][t][2] +
                m_BP4Serializer.m_MetadataSet.MetadataFileLength +
                m_BP4Serializer.m_PreMetadataFileLength;
            const uint64_t currentStepEndPosMetadataFile =
                m_BP4Serializer.m_MetadataIndexTable[m_BP4Serializer.m_RankMPI][t][3] +
                m_BP4Serializer.m_MetadataSet.MetadataFileLength +
                m_BP4Serializer.m_PreMetadataFileLength;
            PopulateMetadataIndexFileContent(m_BP4Serializer.m_MetadataIndex, t,
                                             m_BP4Serializer.m_RankMPI, pgIndexStartMetadataFile,
                                             varIndexStartMetadataFile, attrIndexStartMetadataFile,
                                             currentStepEndPosMetadataFile, currentTimeStamp);
        }

        m_FileMetadataIndexManager.WriteFiles(m_BP4Serializer.m_MetadataIndex.m_Buffer.data(),
                                              m_BP4Serializer.m_MetadataIndex.m_Position);
        m_FileMetadataIndexManager.FlushFiles();

        m_BP4Serializer.m_MetadataSet.MetadataFileLength += m_BP4Serializer.m_Metadata.m_Position;

        if (m_DrainBB)
        {
            for (size_t i = 0; i < m_MetadataIndexFileNames.size(); ++i)
            {
                m_FileDrainer.AddOperationWrite(m_DrainMetadataIndexFileNames[i],
                                                m_BP4Serializer.m_MetadataIndex.m_Position,
                                                m_BP4Serializer.m_MetadataIndex.m_Buffer.data());
            }
        }
    }
    /*Clear the local indices buffer at the end of each step*/
    m_BP4Serializer.ResetBuffer(m_BP4Serializer.m_Metadata, true, true);

    /* clear the metadata index buffer*/
    m_BP4Serializer.ResetBuffer(m_BP4Serializer.m_MetadataIndex, true, true);

    /* reset the metadata index table*/
    m_BP4Serializer.ResetMetadataIndexTable();
    m_BP4Serializer.ResetAllIndices();
}